

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void nivalis::detail::sub_var_ast(AST *ast,int64_t addr,Expr *expr)

{
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *pvVar1;
  reference pvVar2;
  uint64_t in_RSI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_00000018;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_00000020;
  size_t i;
  AST new_ast;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_ffffffffffffff78
  ;
  back_insert_iterator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffff88;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *this;
  back_insert_iterator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffffa8;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *local_38;
  
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x124453);
  local_38 = (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x0;
  do {
    this = local_38;
    pvVar1 = (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
             std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                       (in_RDI);
    if (pvVar1 <= this) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator=
                (in_stack_00000020,in_stack_00000018);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~vector(this);
      return;
    }
    pvVar2 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
             operator[](in_RDI,(size_type)local_38);
    if (pvVar2->opcode == 2) {
      pvVar2 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](in_RDI,(size_type)local_38);
      if ((pvVar2->field_1).ref != in_RSI) goto LAB_00124536;
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
                (in_stack_ffffffffffffff78);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::end
                (in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff88 =
           std::
           back_inserter<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>
                     (in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff98 =
           std::
           copy<__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode_const*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>,std::back_insert_iterator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>
                     (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
      ;
    }
    else {
LAB_00124536:
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                (in_RDI,(size_type)local_38);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                (this,(value_type *)in_stack_ffffffffffffff88.container);
    }
    local_38 = (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               ((long)&(local_38->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

void sub_var_ast(Expr::AST& ast, int64_t addr, const Expr& expr) {
    Expr::AST new_ast;
    for (size_t i = 0; i < ast.size(); ++i) {
        if (ast[i].opcode == OpCode::ref &&
            ast[i].ref == addr) {
            std::copy(expr.ast.begin(), expr.ast.end(), std::back_inserter(new_ast));
        } else {
            new_ast.push_back(ast[i]);
        }
    }
    ast = new_ast;
}